

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
          (SmallVectorBase<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pbVar2;
  undefined8 *puVar3;
  pointer pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  EVP_PKEY_CTX *pEVar10;
  EVP_PKEY_CTX *pEVar11;
  long lVar12;
  long *plVar13;
  EVP_PKEY_CTX *pEVar14;
  EVP_PKEY_CTX *ctx;
  ulong capacity;
  
  pEVar14 = (EVP_PKEY_CTX *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    if (*(long *)(this + 8) == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = *(long *)(this + 8) + 1;
    uVar5 = *(ulong *)(this + 0x10);
    if (capacity < uVar5 * 2) {
      capacity = uVar5 * 2;
    }
    if (0x7fffffffffffffff - uVar5 < uVar5) {
      capacity = 0x7fffffffffffffff;
    }
    lVar8 = (long)pEVar14 - *(long *)this;
    pvVar9 = detail::allocArray(capacity,0x20);
    pbVar2 = (reference)((long)pvVar9 + lVar8);
    puVar3 = (undefined8 *)((long)pvVar9 + lVar8);
    *puVar3 = puVar3 + 2;
    pcVar4 = (args->_M_dataplus)._M_p;
    paVar1 = &args->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      uVar6 = *(undefined8 *)((long)&args->field_2 + 8);
      puVar3[2] = paVar1->_M_allocated_capacity;
      puVar3[3] = uVar6;
    }
    else {
      (pbVar2->_M_dataplus)._M_p = pcVar4;
      (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    pbVar2->_M_string_length = args->_M_string_length;
    (args->_M_dataplus)._M_p = (pointer)paVar1;
    args->_M_string_length = 0;
    (args->field_2)._M_local_buf[0] = '\0';
    pEVar11 = *(EVP_PKEY_CTX **)this;
    lVar12 = *(long *)(this + 8) * 0x20;
    ctx = pEVar11 + lVar12;
    if (ctx == pEVar14) {
      if (*(long *)(this + 8) != 0) {
        plVar13 = (long *)((long)pvVar9 + 0x10);
        pEVar11 = pEVar11 + 0x10;
        do {
          plVar13[-2] = (long)plVar13;
          if (pEVar11 == *(EVP_PKEY_CTX **)(pEVar11 + -0x10)) {
            lVar8 = *(long *)(pEVar11 + 8);
            *plVar13 = *(long *)pEVar11;
            plVar13[1] = lVar8;
          }
          else {
            plVar13[-2] = (long)*(EVP_PKEY_CTX **)(pEVar11 + -0x10);
            *plVar13 = *(long *)pEVar11;
          }
          ctx = *(EVP_PKEY_CTX **)(pEVar11 + -8);
          plVar13[-1] = (long)ctx;
          *(EVP_PKEY_CTX **)(pEVar11 + -0x10) = pEVar11;
          *(long *)(pEVar11 + -8) = 0;
          *pEVar11 = (EVP_PKEY_CTX)0x0;
          plVar13 = plVar13 + 4;
          pEVar11 = pEVar11 + 0x20;
          lVar12 = lVar12 + -0x20;
        } while (lVar12 != 0);
      }
    }
    else {
      if (pEVar11 != pEVar14) {
        plVar13 = (long *)((long)pvVar9 + 0x10);
        pEVar11 = pEVar11 + 0x10;
        do {
          plVar13[-2] = (long)plVar13;
          if (pEVar11 == *(EVP_PKEY_CTX **)(pEVar11 + -0x10)) {
            lVar12 = *(long *)(pEVar11 + 8);
            *plVar13 = *(long *)pEVar11;
            plVar13[1] = lVar12;
          }
          else {
            plVar13[-2] = (long)*(EVP_PKEY_CTX **)(pEVar11 + -0x10);
            *plVar13 = *(long *)pEVar11;
          }
          plVar13[-1] = *(long *)(pEVar11 + -8);
          *(EVP_PKEY_CTX **)(pEVar11 + -0x10) = pEVar11;
          *(long *)(pEVar11 + -8) = 0;
          *pEVar11 = (EVP_PKEY_CTX)0x0;
          plVar13 = plVar13 + 4;
          pEVar10 = pEVar11 + 0x10;
          pEVar11 = pEVar11 + 0x20;
        } while (pEVar10 != pEVar14);
      }
      pEVar11 = (EVP_PKEY_CTX *)(*(long *)(this + 8) * 0x20 + *(long *)this);
      if (pEVar11 != pEVar14) {
        lVar12 = 0;
        do {
          plVar13 = (long *)((long)pvVar9 + lVar12 + lVar8 + 0x30);
          *(long **)((long)pvVar9 + lVar12 + lVar8 + 0x20) = plVar13;
          pEVar10 = pEVar14 + lVar12;
          ctx = pEVar10 + 0x10;
          if (ctx == *(EVP_PKEY_CTX **)pEVar10) {
            lVar7 = *(long *)(pEVar10 + 0x18);
            *plVar13 = *(long *)ctx;
            plVar13[1] = lVar7;
          }
          else {
            *(EVP_PKEY_CTX **)((long)pvVar9 + lVar12 + lVar8 + 0x20) = *(EVP_PKEY_CTX **)pEVar10;
            *(long *)((long)pvVar9 + lVar12 + lVar8 + 0x30) = *(long *)ctx;
          }
          pEVar10 = pEVar14 + lVar12;
          *(undefined8 *)((long)pvVar9 + lVar12 + lVar8 + 0x28) = *(undefined8 *)(pEVar10 + 8);
          *(EVP_PKEY_CTX **)pEVar10 = ctx;
          *(undefined8 *)(pEVar10 + 8) = 0;
          pEVar10[0x10] = (EVP_PKEY_CTX)0x0;
          lVar12 = lVar12 + 0x20;
        } while (pEVar10 + 0x20 != pEVar11);
      }
    }
    SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = capacity;
    *(void **)this = pvVar9;
    return pbVar2;
  }
  *(EVP_PKEY_CTX **)pEVar14 = pEVar14 + 0x10;
  pcVar4 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    lVar8 = *(long *)((long)&args->field_2 + 8);
    *(size_type *)(pEVar14 + 0x10) = paVar1->_M_allocated_capacity;
    *(long *)(pEVar14 + 0x18) = lVar8;
  }
  else {
    *(pointer *)pEVar14 = pcVar4;
    *(size_type *)(pEVar14 + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(pEVar14 + 8) = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  lVar8 = *(long *)(this + 8) + 1;
  *(long *)(this + 8) = lVar8;
  if (lVar8 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<std::basic_string<char>>::back() [T = std::basic_string<char>]"
              );
  }
  return (reference)(lVar8 * 0x20 + *(long *)this + -0x20);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }